

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_utils.cpp
# Opt level: O0

void libtorrent::aux::initialize_storage
               (file_storage *fs,string *save_path,stat_cache *sc,
               vector<download_priority_t,_file_index_t> *file_priority,
               function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&)>
               *create_file,
               function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
               *create_link,
               function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long)>
               *oversized_file,storage_error *ec)

{
  bool bVar1;
  file_flags_t lhs;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> rhs;
  value_type *this;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
  *pfVar2;
  undefined1 auVar3 [16];
  string_view base;
  string_view target_00;
  bool local_20a;
  bool local_209;
  error_condition local_1e8;
  uint local_1d4;
  int local_1d0;
  uint local_1cc;
  undefined1 local_1c8 [40];
  pointer local_1a0;
  allocator<char> local_181;
  string local_180;
  file_index_t local_15c;
  string local_158;
  string local_138;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  string target;
  undefined1 local_e0 [8];
  string path;
  bitfield_flag local_b1;
  int local_b0;
  int local_ac;
  long local_a8;
  int64_t fs_file_size;
  error_condition local_98;
  int local_84;
  int64_t local_80;
  int64_t sz;
  error_code err;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_60;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_5c;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_58;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> file_index;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_4c;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __begin2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range2;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
  *create_link_local;
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&)>
  *create_file_local;
  vector<download_priority_t,_file_index_t> *file_priority_local;
  stat_cache *sc_local;
  string *save_path_local;
  file_storage *fs_local;
  
  pfVar2 = create_link;
  ___end2 = file_storage::file_range(fs);
  local_4c = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
             ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                      *)&__end2);
  rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
        end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
             *)&__end2);
  do {
    file_index = local_4c.m_idx.m_val;
    local_58 = rhs.m_idx.m_val;
    bVar1 = libtorrent::operator!=(local_4c,rhs);
    if (!bVar1) {
      return;
    }
    local_5c = index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
               ::operator*(&local_4c);
    local_60 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
               ::end_index(file_priority);
    bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>
                      (&local_60,&local_5c);
    local_209 = false;
    if (bVar1) {
      err.cat_._4_4_ = local_5c.m_val;
      this = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
             ::operator[](file_priority,local_5c);
      local_209 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::operator==
                            (this,(strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>
                                   *)&dont_download);
    }
    if (local_209 == false) {
      err.cat_._0_4_ = local_5c.m_val;
      bVar1 = file_storage::pad_file_at(fs,(file_index_t)local_5c.m_val);
      if (!bVar1) {
        boost::system::error_code::error_code((error_code *)&sz);
        local_84 = local_5c.m_val;
        local_80 = stat_cache::get_filesize
                             (sc,(file_index_t)local_5c.m_val,fs,save_path,(error_code *)&sz);
        bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&sz);
        local_20a = false;
        if (bVar1) {
          boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                    (&local_98,no_such_file_or_directory,(type *)0x0);
          local_20a = boost::system::operator!=((error_code *)&sz,&local_98);
        }
        if (local_20a != false) {
          fs_file_size._4_4_ = local_5c.m_val;
          storage_error::file(ec,(file_index_t)local_5c.m_val);
          ec->operation = file_stat;
          (ec->ec).val_ = (undefined4)sz;
          (ec->ec).failed_ = (bool)sz._4_1_;
          *(undefined3 *)&(ec->ec).field_0x5 = sz._5_3_;
          (ec->ec).cat_ = (error_category *)err._0_8_;
          return;
        }
        local_ac = local_5c.m_val;
        local_a8 = file_storage::file_size(fs,(file_index_t)local_5c.m_val);
        bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&sz);
        if ((!bVar1) && (local_a8 < local_80)) {
          local_b0 = local_5c.m_val;
          ::std::
          function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long)>
          ::operator()(oversized_file,local_5c,local_80);
        }
        if (local_a8 == 0) {
          lhs = file_storage::file_flags(fs,(file_index_t)local_5c.m_val);
          path.field_2._M_local_buf[0xf] = '\b';
          local_b1 = (bitfield_flag)
                     libtorrent::flags::operator&
                               ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                                lhs.m_val,
                                (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\b'
                               );
          bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_b1);
          if (bVar1) {
            target.field_2._12_4_ = local_5c.m_val;
            file_storage::file_path((string *)local_e0,fs,(file_index_t)local_5c.m_val,save_path);
            local_15c.m_val = local_5c.m_val;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"",&local_181)
            ;
            file_storage::file_path(&local_158,fs,local_15c,&local_180);
            parent_path(&local_138,&local_158);
            auVar3 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                               ((string *)&local_138);
            local_1cc = local_5c.m_val;
            local_118 = auVar3;
            file_storage::symlink_abi_cxx11_
                      ((file_storage *)local_1c8,(char *)fs,(char *)(ulong)(uint)local_5c.m_val);
            auVar3 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1c8)
            ;
            base._M_str = auVar3._0_8_;
            base._M_len = local_118._8_8_;
            target_00._M_str = (char *)pfVar2;
            target_00._M_len = auVar3._8_8_;
            unique0x100006e3 = auVar3;
            lexically_relative_abi_cxx11_
                      ((string *)local_108,(libtorrent *)local_118._0_8_,base,target_00);
            ::std::__cxx11::string::~string((string *)local_1c8);
            ::std::__cxx11::string::~string((string *)&local_138);
            ::std::__cxx11::string::~string((string *)&local_158);
            ::std::__cxx11::string::~string((string *)&local_180);
            ::std::allocator<char>::~allocator(&local_181);
            ::std::
            function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
            ::operator()(create_link,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0,ec);
            bVar1 = boost::system::error_code::operator_cast_to_bool(&ec->ec);
            if (bVar1) {
              local_1d0 = local_5c.m_val;
              storage_error::file(ec,(file_index_t)local_5c.m_val);
            }
            local_1d4 = (uint)bVar1;
            ::std::__cxx11::string::~string((string *)local_108);
            ::std::__cxx11::string::~string((string *)local_e0);
            if (local_1d4 != 0) {
              return;
            }
          }
          else {
            boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                      (&local_1e8,no_such_file_or_directory,(type *)0x0);
            bVar1 = boost::system::operator==((error_code *)&sz,&local_1e8);
            if (bVar1) {
              boost::system::error_code::clear(&ec->ec);
              ::std::
              function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&)>
              ::operator()(create_file,local_5c,ec);
              bVar1 = storage_error::operator_cast_to_bool(ec);
              if (bVar1) {
                return;
              }
            }
          }
        }
        boost::system::error_code::clear(&ec->ec);
      }
    }
    index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
    operator++(&local_4c);
  } while( true );
}

Assistant:

void initialize_storage(file_storage const& fs
		, std::string const& save_path
		, stat_cache& sc
		, aux::vector<download_priority_t, file_index_t> const& file_priority
		, std::function<void(file_index_t, storage_error&)> create_file
		, std::function<void(std::string const&, std::string const&, storage_error&)> create_link
		, std::function<void(file_index_t, std::int64_t)> oversized_file
		, storage_error& ec)
	{
		// create zero-sized files
		for (auto const file_index : fs.file_range())
		{
			// ignore files that have priority 0
			if (file_priority.end_index() > file_index
				&& file_priority[file_index] == dont_download)
			{
				continue;
			}

			// ignore pad files
			if (fs.pad_file_at(file_index)) continue;

			// this is just to see if the file exists
			error_code err;
			auto const sz = sc.get_filesize(file_index, fs, save_path, err);

			if (err && err != boost::system::errc::no_such_file_or_directory)
			{
				ec.file(file_index);
				ec.operation = operation_t::file_stat;
				ec.ec = err;
				break;
			}

			auto const fs_file_size = fs.file_size(file_index);
			if (!err && sz > fs_file_size)
			{
				// this file is oversized, alert the client
				oversized_file(file_index, sz);
			}

			// if the file is empty and doesn't already exist, create it
			// deliberately don't truncate files that already exist
			// if a file is supposed to have size 0, but already exists, we will
			// never truncate it to 0.
			if (fs_file_size == 0)
			{
				// create symlinks
				if (fs.file_flags(file_index) & file_storage::flag_symlink)
				{
#if TORRENT_HAS_SYMLINK
					std::string const path = fs.file_path(file_index, save_path);
					// we make the symlink target relative to the link itself
					std::string const target = lexically_relative(
						parent_path(fs.file_path(file_index)), fs.symlink(file_index));
					create_link(target, path, ec);
					if (ec.ec)
					{
						ec.file(file_index);
						return;
					}
#else
					TORRENT_UNUSED(create_link);
#endif
				}
				else if (err == boost::system::errc::no_such_file_or_directory)
				{
					// just creating the file is enough to make it zero-sized. If
					// there's a race here and some other process truncates the file,
					// it's not a problem, we won't access empty files ever again
					ec.ec.clear();
					create_file(file_index, ec);
					if (ec) return;
				}
			}
			ec.ec.clear();
		}
	}